

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

int getWindowState(_GLFWwindow *window)

{
  unsigned_long uVar1;
  int iVar2;
  anon_struct_16_2_032570bf *state;
  int *local_18;
  
  local_18 = (int *)0x0;
  uVar1 = _glfwGetWindowPropertyX11
                    ((Window)window,_glfw.x11.WM_STATE,_glfw.x11.WM_STATE,(uchar **)&local_18);
  iVar2 = 0;
  if (1 < uVar1) {
    iVar2 = *local_18;
  }
  XFree();
  return iVar2;
}

Assistant:

static int getWindowState(_GLFWwindow* window)
{
    int result = WithdrawnState;
    struct {
        CARD32 state;
        Window icon;
    } *state = NULL;

    if (_glfwGetWindowPropertyX11(window->x11.handle,
                                  _glfw.x11.WM_STATE,
                                  _glfw.x11.WM_STATE,
                                  (unsigned char**) &state) >= 2)
    {
        result = state->state;
    }

    XFree(state);
    return result;
}